

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_25891e7::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ulong uVar2;
  void *__buf_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->sendMutex);
  bVar1 = dap::ContentWriter::isOpen(&this->writer);
  if (bVar1) {
    uVar2 = dap::ContentWriter::write(&this->writer,__fd,__buf_00,__n);
    uVar2 = uVar2 & 0xffffffff;
  }
  else {
    uVar2 = 0;
    EventHandlers::error(&this->handlers,"Send failed as the writer is closed");
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return uVar2;
}

Assistant:

bool send(const std::string& s) {
    std::unique_lock<std::mutex> lock(sendMutex);
    if (!writer.isOpen()) {
      handlers.error("Send failed as the writer is closed");
      return false;
    }
    return writer.write(s);
  }